

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O0

bool __thiscall csm::MIC::RangeList::Range::contains(Range *this,int argVal)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Type *pTVar5;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream strm;
  int nbrSteps;
  Type *currentType;
  int argVal_local;
  Range *this_local;
  
  pTVar5 = type(this);
  if (*pTVar5 == INT_TYPE) {
    iVar1 = Data::intValue(&this->theMinimum);
    if ((iVar1 != argVal) && (iVar1 = Data::intValue(&this->theMaximum), iVar1 != argVal)) {
      iVar1 = Data::intValue(&this->theMinimum);
      if ((iVar1 < argVal) && (iVar1 = Data::intValue(&this->theMaximum), argVal < iVar1)) {
        iVar1 = Data::intValue(&this->theStep);
        if (iVar1 < 2) {
          return true;
        }
        iVar1 = Data::intValue(&this->theMinimum);
        iVar2 = Data::intValue(&this->theStep);
        iVar3 = Data::intValue(&this->theMinimum);
        iVar4 = Data::intValue(&this->theStep);
        return argVal == iVar3 + iVar4 * ((argVal - iVar1) / iVar2);
      }
      return false;
    }
    this_local._7_1_ = true;
  }
  else if (*pTVar5 == DOUBLE_TYPE) {
    this_local._7_1_ = contains(this,(double)argVal);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,argVal);
    std::__cxx11::ostringstream::str();
    this_local._7_1_ = contains(this,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return this_local._7_1_;
}

Assistant:

bool RangeList::Range::contains(int argVal) const
{
   const Data::Type& currentType = type();
   
   if (currentType == Data::INT_TYPE)
   {
      if ((theMinimum.intValue() == argVal) ||
          (theMaximum.intValue() == argVal))
      {
         return true;
      }
      
      if ((theMinimum.intValue() < argVal)  &&
          (theMaximum.intValue() > argVal))
      {  
         //***
         // The step should never < 1, but if so, ignore it.
         //***
         if ((theStep.intValue() <= 1))
         {
            return true;
         }
         
         //***
         // A step size other than 1 implies that the value must be a
         // discrete step between the minimum and maximum to be in the
         // range.
         //***
         int nbrSteps = (argVal - theMinimum.intValue())/
                        theStep.intValue();
         
         return (argVal == (theMinimum.intValue() +
                            theStep.intValue() * nbrSteps));
      }
   }
   else if (currentType == Data::DOUBLE_TYPE)
   {
      return contains((double)argVal);
   }
   else // Data::STRING_TYPE
   {
      std::ostringstream strm;
      strm << argVal;
      
      return contains(strm.str());
   }
   
   return false;
}